

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
::~InternalMetadataWithArenaBase
          (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           *this)

{
  void *pvVar1;
  pointer pUVar2;
  UnknownFieldSet *this_00;
  
  pvVar1 = this->ptr_;
  if (((((ulong)pvVar1 & 1) != 0) && (*(long *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x18) == 0))
     && (this_00 = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),
        this_00 != (UnknownFieldSet *)0x0)) {
    if ((this_00->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this_00->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      UnknownFieldSet::ClearFallback(this_00);
    }
    pUVar2 = (this_00->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pUVar2 != (pointer)0x0) {
      operator_delete(pUVar2,(long)(this_00->fields_).
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pUVar2
                     );
    }
    operator_delete(this_00,0x20);
  }
  this->ptr_ = (void *)0x0;
  return;
}

Assistant:

~InternalMetadataWithArenaBase() {
    if (have_unknown_fields() && arena() == NULL) {
      delete PtrValue<Container>();
    }
    ptr_ = NULL;
  }